

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int parse_base128_integer(CBS *cbs,uint64_t *out)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = cbs->len;
  uVar4 = 0;
  while( true ) {
    sVar3 = sVar3 - 1;
    if (sVar3 == 0xffffffffffffffff) {
      return 0;
    }
    pbVar2 = cbs->data;
    cbs->data = pbVar2 + 1;
    cbs->len = sVar3;
    if (uVar4 >> 0x39 != 0) break;
    bVar1 = *pbVar2;
    uVar4 = (ulong)(bVar1 & 0x7f) | uVar4 << 7;
    if (-1 < (char)bVar1) {
      *out = uVar4;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int parse_base128_integer(CBS *cbs, uint64_t *out) {
  uint64_t v = 0;
  uint8_t b;
  do {
    if (!CBS_get_u8(cbs, &b)) {
      return 0;
    }
    if ((v >> (64 - 7)) != 0) {
      // The value is too large.
      return 0;
    }
    if (v == 0 && b == 0x80) {
      // The value must be minimally encoded.
      return 0;
    }
    v = (v << 7) | (b & 0x7f);

    // Values end at an octet with the high bit cleared.
  } while (b & 0x80);

  *out = v;
  return 1;
}